

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int archive_write_mtree_options(archive_write *a,char *key,char *value)

{
  void *pvVar1;
  int iVar2;
  uint local_34;
  int keybit;
  mtree_writer *mtree;
  char *value_local;
  char *key_local;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  local_34 = 0;
  switch(*key) {
  case 'a':
    iVar2 = strcmp(key,"all");
    if (iVar2 == 0) {
      local_34 = 0xffffffff;
    }
    break;
  case 'c':
    iVar2 = strcmp(key,"cksum");
    local_34 = (uint)(iVar2 == 0);
    break;
  case 'd':
    iVar2 = strcmp(key,"device");
    if (iVar2 == 0) {
      local_34 = 2;
    }
    else {
      iVar2 = strcmp(key,"dironly");
      if (iVar2 == 0) {
        *(uint *)((long)pvVar1 + 0xf4) = (uint)(value != (char *)0x0);
        return 0;
      }
    }
    break;
  case 'f':
    iVar2 = strcmp(key,"flags");
    if (iVar2 == 0) {
      local_34 = 8;
    }
    break;
  case 'g':
    iVar2 = strcmp(key,"gid");
    if (iVar2 == 0) {
      local_34 = 0x10;
    }
    else {
      iVar2 = strcmp(key,"gname");
      if (iVar2 == 0) {
        local_34 = 0x20;
      }
    }
    break;
  case 'i':
    iVar2 = strcmp(key,"indent");
    if (iVar2 == 0) {
      *(uint *)((long)pvVar1 + 0xf8) = (uint)(value != (char *)0x0);
      return 0;
    }
    iVar2 = strcmp(key,"inode");
    if (iVar2 == 0) {
      local_34 = 0x4000000;
    }
    break;
  case 'l':
    iVar2 = strcmp(key,"link");
    if (iVar2 == 0) {
      local_34 = 0x10000;
    }
    break;
  case 'm':
    iVar2 = strcmp(key,"md5");
    if ((iVar2 == 0) || (iVar2 = strcmp(key,"md5digest"), iVar2 == 0)) {
      local_34 = 0x100;
    }
    iVar2 = strcmp(key,"mode");
    if (iVar2 == 0) {
      local_34 = 0x200;
    }
    break;
  case 'n':
    iVar2 = strcmp(key,"nlink");
    if (iVar2 == 0) {
      local_34 = 0x400;
    }
    break;
  case 'r':
    iVar2 = strcmp(key,"resdevice");
    if (iVar2 == 0) {
      local_34 = 0x8000000;
    }
    else {
      iVar2 = strcmp(key,"ripemd160digest");
      if (((iVar2 == 0) || (iVar2 = strcmp(key,"rmd160"), iVar2 == 0)) ||
         (iVar2 = strcmp(key,"rmd160digest"), iVar2 == 0)) {
        local_34 = 0x2000;
      }
    }
    break;
  case 's':
    iVar2 = strcmp(key,"sha1");
    if ((iVar2 == 0) || (iVar2 = strcmp(key,"sha1digest"), iVar2 == 0)) {
      local_34 = 0x4000;
    }
    iVar2 = strcmp(key,"sha256");
    if ((iVar2 == 0) || (iVar2 = strcmp(key,"sha256digest"), iVar2 == 0)) {
      local_34 = 0x800000;
    }
    iVar2 = strcmp(key,"sha384");
    if ((iVar2 == 0) || (iVar2 = strcmp(key,"sha384digest"), iVar2 == 0)) {
      local_34 = 0x1000000;
    }
    iVar2 = strcmp(key,"sha512");
    if ((iVar2 == 0) || (iVar2 = strcmp(key,"sha512digest"), iVar2 == 0)) {
      local_34 = 0x2000000;
    }
    iVar2 = strcmp(key,"size");
    if (iVar2 == 0) {
      local_34 = 0x8000;
    }
    break;
  case 't':
    iVar2 = strcmp(key,"time");
    if (iVar2 == 0) {
      local_34 = 0x40000;
    }
    else {
      iVar2 = strcmp(key,"type");
      if (iVar2 == 0) {
        local_34 = 0x80000;
      }
    }
    break;
  case 'u':
    iVar2 = strcmp(key,"uid");
    if (iVar2 == 0) {
      local_34 = 0x100000;
    }
    else {
      iVar2 = strcmp(key,"uname");
      if (iVar2 == 0) {
        local_34 = 0x200000;
      }
      else {
        iVar2 = strcmp(key,"use-set");
        if (iVar2 == 0) {
          *(uint *)((long)pvVar1 + 0xfc) = (uint)(value != (char *)0x0);
          return 0;
        }
      }
    }
  }
  if (local_34 == 0) {
    a_local._4_4_ = -0x14;
  }
  else {
    if (value == (char *)0x0) {
      *(uint *)((long)pvVar1 + 0xf0) = (local_34 ^ 0xffffffff) & *(uint *)((long)pvVar1 + 0xf0);
    }
    else {
      *(uint *)((long)pvVar1 + 0xf0) = local_34 | *(uint *)((long)pvVar1 + 0xf0);
    }
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_write_mtree_options(struct archive_write *a, const char *key,
    const char *value)
{
	struct mtree_writer *mtree= a->format_data;
	int keybit = 0;

	switch (key[0]) {
	case 'a':
		if (strcmp(key, "all") == 0)
			keybit = ~0;
		break;
	case 'c':
		if (strcmp(key, "cksum") == 0)
			keybit = F_CKSUM;
		break;
	case 'd':
		if (strcmp(key, "device") == 0)
			keybit = F_DEV;
		else if (strcmp(key, "dironly") == 0) {
			mtree->dironly = (value != NULL)? 1: 0;
			return (ARCHIVE_OK);
		}
		break;
	case 'f':
		if (strcmp(key, "flags") == 0)
			keybit = F_FLAGS;
		break;
	case 'g':
		if (strcmp(key, "gid") == 0)
			keybit = F_GID;
		else if (strcmp(key, "gname") == 0)
			keybit = F_GNAME;
		break;
	case 'i':
		if (strcmp(key, "indent") == 0) {
			mtree->indent = (value != NULL)? 1: 0;
			return (ARCHIVE_OK);
		} else if (strcmp(key, "inode") == 0) {
			keybit = F_INO;
		}
		break;
	case 'l':
		if (strcmp(key, "link") == 0)
			keybit = F_SLINK;
		break;
	case 'm':
		if (strcmp(key, "md5") == 0 ||
		    strcmp(key, "md5digest") == 0)
			keybit = F_MD5;
		if (strcmp(key, "mode") == 0)
			keybit = F_MODE;
		break;
	case 'n':
		if (strcmp(key, "nlink") == 0)
			keybit = F_NLINK;
		break;
	case 'r':
		if (strcmp(key, "resdevice") == 0) {
			keybit = F_RESDEV;
		} else if (strcmp(key, "ripemd160digest") == 0 ||
		    strcmp(key, "rmd160") == 0 ||
		    strcmp(key, "rmd160digest") == 0)
			keybit = F_RMD160;
		break;
	case 's':
		if (strcmp(key, "sha1") == 0 ||
		    strcmp(key, "sha1digest") == 0)
			keybit = F_SHA1;
		if (strcmp(key, "sha256") == 0 ||
		    strcmp(key, "sha256digest") == 0)
			keybit = F_SHA256;
		if (strcmp(key, "sha384") == 0 ||
		    strcmp(key, "sha384digest") == 0)
			keybit = F_SHA384;
		if (strcmp(key, "sha512") == 0 ||
		    strcmp(key, "sha512digest") == 0)
			keybit = F_SHA512;
		if (strcmp(key, "size") == 0)
			keybit = F_SIZE;
		break;
	case 't':
		if (strcmp(key, "time") == 0)
			keybit = F_TIME;
		else if (strcmp(key, "type") == 0)
			keybit = F_TYPE;
		break;
	case 'u':
		if (strcmp(key, "uid") == 0)
			keybit = F_UID;
		else if (strcmp(key, "uname") == 0)
			keybit = F_UNAME;
		else if (strcmp(key, "use-set") == 0) {
			mtree->output_global_set = (value != NULL)? 1: 0;
			return (ARCHIVE_OK);
		}
		break;
	}
	if (keybit != 0) {
		if (value != NULL)
			mtree->keys |= keybit;
		else
			mtree->keys &= ~keybit;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}